

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_bad_attrsz(_internal_exr_seq_scratch *scratch,int32_t attrsz,int32_t eltsize,char *aname,
                char *tname,int32_t *outsz)

{
  int iVar1;
  exr_result_t eVar2;
  undefined8 in_RCX;
  int in_EDX;
  uint in_ESI;
  _internal_exr_seq_scratch *in_RDI;
  undefined8 in_R8;
  uint *in_R9;
  int32_t n;
  exr_result_t local_4;
  
  *in_R9 = in_ESI;
  if ((int)in_ESI < 0) {
    local_4 = (*in_RDI->ctxt->print_error)
                        (in_RDI->ctxt,0x11,"Attribute \'%s\', type \'%s\': Invalid negative size %d"
                         ,in_RCX,in_R8,(ulong)in_ESI);
  }
  else {
    iVar1 = scratch_attr_too_big(in_RDI,in_ESI);
    if (iVar1 == 0) {
      if (1 < in_EDX) {
        if (in_ESI != ((int)in_ESI / in_EDX) * in_EDX) {
          eVar2 = (*in_RDI->ctxt->print_error)
                            (in_RDI->ctxt,0x11,
                             "Attribute \'%s\': Invalid size %d (exp \'%s\' size 4 * n, found odd bytes %d)"
                             ,in_RCX,(ulong)in_ESI,in_R8,(int)in_ESI % in_EDX);
          return eVar2;
        }
        *in_R9 = (int)in_ESI / in_EDX;
      }
      local_4 = 0;
    }
    else {
      local_4 = (*in_RDI->ctxt->print_error)
                          (in_RDI->ctxt,0x11,"Attribute \'%s\', type \'%s\': Invalid size %d",in_RCX
                           ,in_R8,(ulong)in_ESI);
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
check_bad_attrsz (
    struct _internal_exr_seq_scratch* scratch,
    int32_t                           attrsz,
    int32_t                           eltsize,
    const char*                       aname,
    const char*                       tname,
    int32_t*                          outsz)
{
    int32_t n = attrsz;

    *outsz = n;
    if (attrsz < 0)
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid negative size %d",
            aname,
            tname,
            attrsz);

    if (scratch_attr_too_big (scratch, attrsz))
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid size %d",
            aname,
            tname,
            attrsz);

    if (eltsize > 1)
    {
        n = attrsz / eltsize;
        if (attrsz != (int32_t) (n * eltsize))
            return scratch->ctxt->print_error (
                scratch->ctxt,
                EXR_ERR_ATTR_SIZE_MISMATCH,
                "Attribute '%s': Invalid size %d (exp '%s' size 4 * n, found odd bytes %d)",
                aname,
                attrsz,
                tname,
                (attrsz % eltsize));
        *outsz = n;
    }

    return EXR_ERR_SUCCESS;
}